

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.h
# Opt level: O0

ostream * operator<<(ostream *os,Employee *employee)

{
  ostream *poVar1;
  Employee *employee_local;
  ostream *os_local;
  
  poVar1 = operator<<(os,&employee->super_Person);
  poVar1 = std::operator<<(poVar1," hourWork: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,employee->hourWork);
  poVar1 = std::operator<<(poVar1," salaryPerHour: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,employee->salaryPerHour);
  poVar1 = std::operator<<(poVar1," workToDo: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,employee->workToDo);
  poVar1 = std::operator<<(poVar1," workDone: ");
  std::ostream::operator<<(poVar1,employee->workDone);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Employee &employee) {
        os << static_cast<const Person &>(employee) << " hourWork: " << employee.hourWork << " salaryPerHour: "
           << employee.salaryPerHour << " workToDo: " << employee.workToDo << " workDone: " << employee.workDone;
        return os;
    }